

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDemiterToDual(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  int iLit1;
  Vec_Int_t *p_00;
  Vec_Int_t *vNodes;
  Gia_Man_t *p_01;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  uint nNodes;
  int iVar5;
  
  p_00 = Gia_ManCollectTopXors(p);
  if (p_00 == (Vec_Int_t *)0x0) {
    puts("Cannot demiter because the top-most gate is an AND-gate.");
    p_01 = (Gia_Man_t *)0x0;
  }
  else {
    nNodes = p_00->nSize;
    if ((nNodes & 1) != 0) {
      __assert_fail("Vec_IntSize(vOrder) % 2 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                    ,0x11a4,"Gia_Man_t *Gia_ManDemiterToDual(Gia_Man_t *)");
    }
    vNodes = Vec_IntAlloc(p->nObjs);
    Gia_ManIncrementTravId(p);
    iVar5 = 0;
    Gia_ManCollectAnds(p,p_00->pArray,nNodes,vNodes,(Vec_Int_t *)0x0);
    p_01 = Gia_ManStart(vNodes->nSize + p->vCis->nSize + nNodes + 1);
    pcVar3 = Abc_UtilStrsav(p->pName);
    p_01->pName = pcVar3;
    pcVar3 = Abc_UtilStrsav(p->pSpec);
    p_01->pSpec = pcVar3;
    p->pObjs->Value = 0;
    while ((iVar5 < p->vCis->nSize && (pGVar4 = Gia_ManCi(p,iVar5), pGVar4 != (Gia_Obj_t *)0x0))) {
      uVar1 = Gia_ManAppendCi(p_01);
      pGVar4->Value = uVar1;
      iVar5 = iVar5 + 1;
    }
    for (iVar5 = 0; iVar5 < vNodes->nSize; iVar5 = iVar5 + 1) {
      iVar2 = Vec_IntEntry(vNodes,iVar5);
      pGVar4 = Gia_ManObj(p,iVar2);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      iVar2 = Gia_ObjFanin0Copy(pGVar4);
      iLit1 = Gia_ObjFanin1Copy(pGVar4);
      uVar1 = Gia_ManAppendAnd(p_01,iVar2,iLit1);
      pGVar4->Value = uVar1;
    }
    uVar1 = 0;
    pGVar4 = Gia_ManCo(p,0);
    if (pGVar4 + -(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff) == p->pObjs) {
      Gia_ManAppendCo(p_01,0);
      Gia_ManAppendCo(p_01,*(uint *)pGVar4 >> 0x1d & 1);
    }
    else {
      Gia_ManSetPhase(p);
      if ((int)nNodes < 1) {
        nNodes = 0;
      }
      for (; nNodes != uVar1; uVar1 = uVar1 + 1) {
        iVar5 = Vec_IntEntry(p_00,uVar1);
        pGVar4 = Gia_ManObj(p,iVar5);
        if (pGVar4 == (Gia_Obj_t *)0x0) break;
        iVar5 = Abc_LitNotCond(pGVar4->Value,(uint)((ulong)*(undefined8 *)pGVar4 >> 0x3f));
        Gia_ManAppendCo(p_01,iVar5);
      }
    }
    Vec_IntFree(vNodes);
    Vec_IntFree(p_00);
  }
  return p_01;
}

Assistant:

Gia_Man_t * Gia_ManDemiterToDual( Gia_Man_t * p )
{
    Gia_Man_t * pNew; Gia_Obj_t * pObj; int i;
    Vec_Int_t * vNodes;
    Vec_Int_t * vOrder = Gia_ManCollectTopXors( p );
    if ( vOrder == NULL )
    {
        printf( "Cannot demiter because the top-most gate is an AND-gate.\n" );
        return NULL;
    }
    assert( Vec_IntSize(vOrder) % 2 == 0 );
    vNodes = Vec_IntAlloc( Gia_ManObjNum(p) );
    Gia_ManIncrementTravId( p );
    Gia_ManCollectAnds( p, Vec_IntArray(vOrder), Vec_IntSize(vOrder), vNodes, NULL );
    pNew = Gia_ManStart( 1 + Gia_ManCiNum(p) + Vec_IntSize(vNodes) + Vec_IntSize(vOrder) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    pObj = Gia_ManCo(p, 0);
    if ( Gia_ObjFanin0(pObj) == Gia_ManConst0(p) )
    {
        Gia_ManAppendCo( pNew, 0 );
        Gia_ManAppendCo( pNew, Gia_ObjFaninC0(pObj) );
    }
    else
    {
        Gia_ManSetPhase( p );
        Gia_ManForEachObjVec( vOrder, p, pObj, i )
            Gia_ManAppendCo( pNew, Abc_LitNotCond(pObj->Value, pObj->fPhase) );
    }
    Vec_IntFree( vNodes );
    Vec_IntFree( vOrder );
    return pNew;
}